

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O1

bool __thiscall
QCss::ValueExtractor::extractBox(ValueExtractor *this,int *margins,int *paddings,int *spacing)

{
  Declaration *pDVar1;
  int iVar2;
  int *m;
  long lVar3;
  Declaration *decl;
  bool bVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  int dummy;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fontExtracted == 0) {
    local_3c = -0xff;
    extractFont(this,&this->f,&local_3c);
  }
  if ((this->declarations).d.size == 0) {
    bVar4 = false;
  }
  else {
    lVar3 = 0;
    uVar5 = 0;
    bVar4 = false;
    do {
      pDVar1 = (this->declarations).d.ptr;
      decl = (Declaration *)((long)&(pDVar1->d).d.ptr + lVar3);
      iVar2 = *(int *)(*(long *)((long)&(pDVar1->d).d.ptr + lVar3) + 0x20);
      switch(iVar2) {
      case 9:
        m = margins;
LAB_005e6003:
        lengthValues(this,decl,m);
        break;
      case 10:
        iVar2 = lengthValue(this,decl);
        margins[2] = iVar2;
        break;
      case 0xb:
        iVar2 = lengthValue(this,decl);
        margins[3] = iVar2;
        break;
      case 0xc:
        iVar2 = lengthValue(this,decl);
        margins[1] = iVar2;
        break;
      case 0xd:
        iVar2 = lengthValue(this,decl);
        *margins = iVar2;
        break;
      default:
        switch(iVar2) {
        case 0x20:
          m = paddings;
          goto LAB_005e6003;
        case 0x21:
          iVar2 = lengthValue(this,decl);
          paddings[3] = iVar2;
          break;
        case 0x22:
          iVar2 = lengthValue(this,decl);
          paddings[1] = iVar2;
          break;
        case 0x23:
          iVar2 = lengthValue(this,decl);
          *paddings = iVar2;
          break;
        case 0x24:
          iVar2 = lengthValue(this,decl);
          paddings[2] = iVar2;
          break;
        default:
          if ((iVar2 == 0x44) && (bVar4 = true, spacing != (int *)0x0)) {
            iVar2 = lengthValue(this,decl);
            *spacing = iVar2;
          }
          goto LAB_005e60ab;
        }
      }
      bVar4 = true;
LAB_005e60ab:
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 8;
    } while (uVar5 < (ulong)(this->declarations).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool ValueExtractor::extractBox(int *margins, int *paddings, int *spacing)
{
    extractFont();
    bool hit = false;
    for (int i = 0; i < declarations.size(); i++) {
        const Declaration &decl = declarations.at(i);
        switch (decl.d->propertyId) {
        case PaddingLeft: paddings[LeftEdge] = lengthValue(decl); break;
        case PaddingRight: paddings[RightEdge] = lengthValue(decl); break;
        case PaddingTop: paddings[TopEdge] = lengthValue(decl); break;
        case PaddingBottom: paddings[BottomEdge] = lengthValue(decl); break;
        case Padding: lengthValues(decl, paddings); break;

        case MarginLeft: margins[LeftEdge] = lengthValue(decl); break;
        case MarginRight: margins[RightEdge] = lengthValue(decl); break;
        case MarginTop: margins[TopEdge] = lengthValue(decl); break;
        case MarginBottom: margins[BottomEdge] = lengthValue(decl); break;
        case Margin: lengthValues(decl, margins); break;
        case QtSpacing: if (spacing) *spacing = lengthValue(decl); break;

        default: continue;
        }
        hit = true;
    }

    return hit;
}